

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::setCallback(Highs *this,HighsCCallbackType c_callback,void *user_callback_data)

{
  _Manager_type in_RDX;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *in_RDI;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *unaff_retaddr;
  HighsCallback *in_stack_ffffffffffffffe0;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *__x;
  
  __x = in_RDI;
  HighsCallback::clear(in_stack_ffffffffffffffe0);
  std::
  function<void(int,std::__cxx11::string_const&,HighsCallbackDataOut_const*,HighsCallbackDataIn*,void*)>
  ::operator=(unaff_retaddr,(anon_class_8_1_11005a5f *)__x);
  in_RDI[0x4e].super__Function_base._M_manager = in_RDX;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator=(unaff_retaddr,__x);
  in_RDI[0x73]._M_invoker = (_Invoker_type)in_RDI[0x4e].super__Function_base._M_manager;
  in_RDI[0x74].super__Function_base._M_functor._M_pod_data[0] = '\0';
  return kOk;
}

Assistant:

HighsStatus Highs::setCallback(HighsCCallbackType c_callback,
                               void* user_callback_data) {
  this->callback_.clear();
  this->callback_.user_callback =
      [c_callback](int a, const std::string& b, const HighsCallbackDataOut* c,
                   HighsCallbackDataIn* d,
                   void* e) { c_callback(a, b.c_str(), c, d, e); };
  this->callback_.user_callback_data = user_callback_data;

  options_.log_options.user_callback = this->callback_.user_callback;
  options_.log_options.user_callback_data = this->callback_.user_callback_data;
  options_.log_options.user_callback_active = false;
  return HighsStatus::kOk;
}